

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrLocateBodyJointsBD
                   (XrBodyTrackerBD bodyTracker,XrBodyJointsLocateInfoBD *locateInfo,
                   XrBodyJointLocationsBD *locations)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrBodyTrackerBD_T_*>::getWithInstanceInfo(&g_bodytrackerbd_info,bodyTracker);
  XVar1 = (*(pVar2.second)->dispatch_table->LocateBodyJointsBD)(bodyTracker,locateInfo,locations);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrLocateBodyJointsBD(
    XrBodyTrackerBD bodyTracker,
    const XrBodyJointsLocateInfoBD* locateInfo,
    XrBodyJointLocationsBD* locations) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_bodytrackerbd_info.getWithInstanceInfo(bodyTracker);
        GenValidUsageXrHandleInfo *gen_bodytrackerbd_info = info_with_instance.first;
        (void)gen_bodytrackerbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->LocateBodyJointsBD(bodyTracker, locateInfo, locations);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}